

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

uint16_t * icu_63::getGroup(UCharNames *names,uint32_t code)

{
  ushort *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  puVar1 = (ushort *)((long)&names->tokenStringOffset + (ulong)names->groupsOffset);
  uVar4 = 0;
  uVar2 = (uint)*puVar1;
  if (1 < uVar2) {
    uVar5 = 0;
    do {
      uVar3 = uVar2 + (int)uVar4 >> 1;
      if ((code >> 5 & 0xffff) < (uint)puVar1[(ulong)(uVar3 * 3) + 1]) {
        uVar2 = uVar3;
        uVar3 = uVar5;
      }
      uVar5 = uVar3;
      uVar4 = (ulong)uVar5;
    } while ((int)uVar5 < (int)(uVar2 - 1));
    uVar4 = (ulong)(uVar5 * 3);
  }
  return puVar1 + uVar4 + 1;
}

Assistant:

static const uint16_t *
getGroup(UCharNames *names, uint32_t code) {
    const uint16_t *groups=GET_GROUPS(names);
    uint16_t groupMSB=(uint16_t)(code>>GROUP_SHIFT),
             start=0,
             limit=*groups++,
             number;

    /* binary search for the group of names that contains the one for code */
    while(start<limit-1) {
        number=(uint16_t)((start+limit)/2);
        if(groupMSB<groups[number*GROUP_LENGTH+GROUP_MSB]) {
            limit=number;
        } else {
            start=number;
        }
    }

    /* return this regardless of whether it is an exact match */
    return groups+start*GROUP_LENGTH;
}